

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

vm_obj_id_t CVmObjGramProd::create_from_stack(uchar **pc_ptr,uint argc)

{
  vm_obj_id_t vVar1;
  CVmObject *this;
  vm_gram_ext *pvVar2;
  int in_ESI;
  CVmObjGramProd *prod;
  vm_obj_id_t id;
  undefined8 in_stack_ffffffffffffffe8;
  vm_obj_id_t obj_id;
  int in_stack_fffffffffffffff0;
  
  obj_id = (vm_obj_id_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  vVar1 = vm_new_id(in_ESI,in_stack_fffffffffffffff0,obj_id);
  CVmObject::operator_new(CONCAT44(in_ESI,vVar1),obj_id);
  CVmObjGramProd((CVmObjGramProd *)pc_ptr);
  this = vm_objp(0);
  pvVar2 = get_ext((CVmObjGramProd *)this);
  pvVar2->field_0x14 = pvVar2->field_0x14 & 0xfe | 1;
  if (in_ESI == 0) {
    CVmStack::discard(0);
    return vVar1;
  }
  err_throw(0);
}

Assistant:

vm_obj_id_t CVmObjGramProd::create_from_stack(VMG_ const uchar **pc_ptr,
                                              uint argc)
{
    /* create an empty new grammar production */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, TRUE, TRUE);
    new (vmg_ id) CVmObjGramProd(vmg0_);
    CVmObjGramProd *prod = (CVmObjGramProd *)vm_objp(vmg_ id);

    /* 
     *   mark the object as modified-since-load, since it was never part of
     *   the image file 
     */
    prod->get_ext()->modified_ = TRUE;

    /* check arguments */
    if (argc == 0)
    {
        /* no arguments - create a new production with no rules defined */
    }
    else
    {
        /* invalid argument list */
        err_throw(VMERR_WRONG_NUM_OF_ARGS);
    }

    /* discard arguments */
    G_stk->discard(argc);

    /* return the new ID */
    return id;
}